

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O3

void __thiscall
wasm::OptimizationOptions::addPassArg(OptimizationOptions *this,string *key,string *value)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer __s2;
  size_t __n;
  string *__k;
  char cVar3;
  int iVar4;
  string *psVar5;
  mapped_type *pmVar6;
  pointer pPVar7;
  undefined1 local_1d0 [392];
  OptimizationOptions *local_48;
  string *local_40;
  string *local_38;
  
  pPVar2 = (this->passes).
           super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar7 = (this->passes).
           super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = this;
  local_40 = value;
  local_38 = key;
  if (pPVar7 != pPVar2) {
    __s2 = (key->_M_dataplus)._M_p;
    __n = key->_M_string_length;
    do {
      pPVar1 = pPVar7 + -1;
      if (pPVar7[-1].name._M_string_length == __n) {
        if (__n != 0) {
          iVar4 = bcmp((pPVar1->name)._M_dataplus._M_p,__s2,__n);
          if (iVar4 != 0) goto LAB_001abe07;
        }
        if (pPVar7[-1].argument.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged != true) {
          std::optional<std::__cxx11::string>::operator=
                    ((optional<std::__cxx11::string> *)&pPVar7[-1].argument,local_40);
          return;
        }
        Fatal::Fatal((Fatal *)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1d0 + 0x10),pPVar7[-1].name._M_dataplus._M_p,
                   pPVar7[-1].name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1d0 + 0x10)," already set to ",0x10);
        Fatal::operator<<((Fatal *)local_1d0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &pPVar7[-1].argument);
        goto LAB_001abf18;
      }
LAB_001abe07:
      pPVar7 = pPVar1;
    } while (pPVar1 != pPVar2);
  }
  psVar5 = (string *)wasm::PassRegistry::get();
  __k = local_38;
  cVar3 = wasm::PassRegistry::containsPass(psVar5);
  if (cVar3 == '\0') {
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(local_48->super_ToolOptions).passOptions.arguments,__k);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    return;
  }
  Fatal::Fatal((Fatal *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1d0 + 0x10),"can\'t set ",10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1d0 + 0x10),(local_38->_M_dataplus)._M_p,local_38->_M_string_length);
  Fatal::operator<<((Fatal *)local_1d0,(char (*) [19])": pass not enabled");
LAB_001abf18:
  Fatal::~Fatal((Fatal *)local_1d0);
}

Assistant:

void addPassArg(const std::string& key, const std::string& value) override {
    // Scan the current pass list for the last defined instance of a pass named
    // like the argument under consideration.
    for (auto i = passes.rbegin(); i != passes.rend(); i++) {
      if (i->name != key) {
        continue;
      }

      if (i->argument.has_value()) {
        Fatal() << i->name << " already set to " << *(i->argument);
      }

      // Found? Store the argument value there and return.
      i->argument = value;
      return;
    }

    // Not found? Store it globally if there is no pass with the same name.
    if (!PassRegistry::get()->containsPass(key)) {
      return ToolOptions::addPassArg(key, value);
    }

    // Not found, but we have a pass with the same name? Bail out.
    Fatal() << "can't set " << key << ": pass not enabled";
  }